

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3813_9::GetStateBlock
          (ChElementHexaANCF_3813_9 *this,ChVectorDynamic<> *mD)

{
  long lVar1;
  pointer psVar2;
  element_type *peVar3;
  element_type *peVar4;
  double *pdVar5;
  Index index_3;
  uint uVar6;
  ulong uVar7;
  int i;
  long lVar8;
  double *pdVar9;
  Index index;
  ulong uVar10;
  
  lVar1 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  pdVar5 = (mD->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  psVar2 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = 0;
  pdVar9 = pdVar5;
  do {
    if (lVar1 + -3 < lVar8 * 3) goto LAB_006dd04d;
    uVar10 = 3;
    peVar3 = psVar2[lVar8].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (((ulong)pdVar5 & 7) == 0) {
      uVar6 = -((uint)((ulong)(pdVar5 + lVar8 * 3) >> 3) & 0x1fffffff) & 7;
      if ((ulong)uVar6 < 3) {
        uVar10 = (ulong)uVar6;
      }
      if (uVar6 != 0) goto LAB_006dced8;
    }
    else {
LAB_006dced8:
      uVar7 = 0;
      do {
        pdVar9[uVar7] = *(double *)((long)&peVar3->super_ChNodeFEAbase + uVar7 * 8 + 0x20);
        uVar7 = uVar7 + 1;
      } while (uVar10 != uVar7);
    }
    if (uVar10 < 3) {
      do {
        pdVar9[uVar10] = *(double *)((long)&peVar3->super_ChNodeFEAbase + uVar10 * 8 + 0x20);
        uVar10 = uVar10 + 1;
      } while (uVar10 != 3);
    }
    lVar8 = lVar8 + 1;
    pdVar9 = pdVar9 + 3;
  } while (lVar8 != 8);
  if (lVar1 < 0x1b) goto LAB_006dd04d;
  peVar4 = (this->m_central_node).
           super___shared_ptr<chrono::fea::ChNodeFEAcurv,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pdVar9 = pdVar5 + 0x18;
  uVar10 = 3;
  if (((ulong)pdVar9 & 7) == 0) {
    uVar6 = -((uint)((ulong)pdVar9 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar6 < 3) {
      uVar10 = (ulong)uVar6;
    }
    if (uVar6 != 0) goto LAB_006dcf56;
  }
  else {
LAB_006dcf56:
    uVar7 = 0;
    do {
      pdVar9[uVar7] = *(double *)((long)(&peVar4->m_ryy + -1) + uVar7 * 8);
      uVar7 = uVar7 + 1;
    } while (uVar10 != uVar7);
  }
  if (uVar10 < 3) {
    do {
      pdVar9[uVar10] = *(double *)((long)(&peVar4->m_ryy + -1) + uVar10 * 8);
      uVar10 = uVar10 + 1;
    } while (uVar10 != 3);
  }
  if (lVar1 < 0x1e) goto LAB_006dd04d;
  pdVar9 = pdVar5 + 0x1b;
  uVar10 = 3;
  if (((ulong)pdVar9 & 7) == 0) {
    uVar6 = -((uint)((ulong)pdVar9 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar6 < 3) {
      uVar10 = (ulong)uVar6;
    }
    if (uVar6 != 0) goto LAB_006dcfbf;
  }
  else {
LAB_006dcfbf:
    uVar7 = 0;
    do {
      pdVar9[uVar7] = (peVar4->m_ryy).m_data[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar10 != uVar7);
  }
  if (uVar10 < 3) {
    do {
      pdVar9[uVar10] = (peVar4->m_ryy).m_data[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar10 != 3);
  }
  if (lVar1 < 0x21) {
LAB_006dd04d:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar5 = pdVar5 + 0x1e;
  uVar10 = 3;
  if (((ulong)pdVar5 & 7) == 0) {
    uVar6 = -((uint)((ulong)pdVar5 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar6 < 3) {
      uVar10 = (ulong)uVar6;
    }
    if (uVar6 == 0) goto LAB_006dd031;
  }
  uVar7 = 0;
  do {
    pdVar5[uVar7] = (peVar4->m_rzz).m_data[uVar7];
    uVar7 = uVar7 + 1;
  } while (uVar10 != uVar7);
LAB_006dd031:
  if (uVar10 < 3) {
    do {
      pdVar5[uVar10] = (peVar4->m_rzz).m_data[uVar10];
      uVar10 = uVar10 + 1;
    } while (uVar10 != 3);
  }
  return;
}

Assistant:

void ChElementHexaANCF_3813_9::GetStateBlock(ChVectorDynamic<>& mD) {
    for (int i = 0; i < 8; i++) {
        mD.segment(3 * i, 3) = m_nodes[i]->GetPos().eigen();
    }
    mD.segment(24, 3) = m_central_node->GetCurvatureXX().eigen();
    mD.segment(27, 3) = m_central_node->GetCurvatureYY().eigen();
    mD.segment(30, 3) = m_central_node->GetCurvatureZZ().eigen();
}